

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O3

parse_error *
nlohmann::detail::parse_error::create
          (parse_error *__return_storage_ptr__,int id_,size_t byte_,string *what_arg)

{
  undefined8 *puVar1;
  bool bVar2;
  char cVar3;
  long *plVar4;
  undefined8 *puVar5;
  ulong *puVar6;
  size_t sVar7;
  long *plVar8;
  char cVar9;
  ulong uVar10;
  string w;
  ulong *local_130;
  long local_128;
  ulong local_120;
  long lStack_118;
  undefined8 *local_110;
  undefined8 local_108;
  undefined8 local_100;
  undefined8 uStack_f8;
  ulong *local_f0;
  long local_e8;
  ulong local_e0;
  undefined4 uStack_d8;
  undefined4 uStack_d4;
  string local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  char *local_70;
  uint local_68;
  char local_60 [16];
  string local_50;
  
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_d0,"parse_error","");
  exception::name(&local_50,&local_d0,id_);
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_50);
  puVar6 = (ulong *)(plVar4 + 2);
  if ((ulong *)*plVar4 == puVar6) {
    local_e0 = *puVar6;
    uStack_d8 = (undefined4)plVar4[3];
    uStack_d4 = *(undefined4 *)((long)plVar4 + 0x1c);
    local_f0 = &local_e0;
  }
  else {
    local_e0 = *puVar6;
    local_f0 = (ulong *)*plVar4;
  }
  local_e8 = plVar4[1];
  *plVar4 = (long)puVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (byte_ == 0) {
    local_130 = &local_120;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_130,"");
  }
  else {
    cVar9 = '\x01';
    if (9 < byte_) {
      sVar7 = byte_;
      cVar3 = '\x04';
      do {
        cVar9 = cVar3;
        if (sVar7 < 100) {
          cVar9 = cVar9 + -2;
          goto LAB_0019d133;
        }
        if (sVar7 < 1000) {
          cVar9 = cVar9 + -1;
          goto LAB_0019d133;
        }
        if (sVar7 < 10000) goto LAB_0019d133;
        bVar2 = 99999 < sVar7;
        sVar7 = sVar7 / 10000;
        cVar3 = cVar9 + '\x04';
      } while (bVar2);
      cVar9 = cVar9 + '\x01';
    }
LAB_0019d133:
    local_70 = local_60;
    std::__cxx11::string::_M_construct((ulong)&local_70,cVar9);
    std::__detail::__to_chars_10_impl<unsigned_long>(local_70,local_68,byte_);
    plVar4 = (long *)std::__cxx11::string::replace((ulong)&local_70,0,(char *)0x0,0x40350f);
    local_130 = &local_120;
    puVar6 = (ulong *)(plVar4 + 2);
    if ((ulong *)*plVar4 == puVar6) {
      local_120 = *puVar6;
      lStack_118 = plVar4[3];
    }
    else {
      local_120 = *puVar6;
      local_130 = (ulong *)*plVar4;
    }
    local_128 = plVar4[1];
    *plVar4 = (long)puVar6;
    plVar4[1] = 0;
    *(undefined1 *)(plVar4 + 2) = 0;
  }
  uVar10 = 0xf;
  if (local_f0 != &local_e0) {
    uVar10 = local_e0;
  }
  if (uVar10 < (ulong)(local_128 + local_e8)) {
    uVar10 = 0xf;
    if (local_130 != &local_120) {
      uVar10 = local_120;
    }
    if ((ulong)(local_128 + local_e8) <= uVar10) {
      puVar5 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_130,0,(char *)0x0,(ulong)local_f0);
      goto LAB_0019d226;
    }
  }
  puVar5 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_f0,(ulong)local_130);
LAB_0019d226:
  local_110 = &local_100;
  puVar1 = puVar5 + 2;
  if ((undefined8 *)*puVar5 == puVar1) {
    local_100 = *puVar1;
    uStack_f8 = puVar5[3];
  }
  else {
    local_100 = *puVar1;
    local_110 = (undefined8 *)*puVar5;
  }
  local_108 = puVar5[1];
  *puVar5 = puVar1;
  puVar5[1] = 0;
  *(undefined1 *)puVar1 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_110);
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_80 = *plVar8;
    lStack_78 = plVar4[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar8;
    local_90 = (long *)*plVar4;
  }
  local_88 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  plVar4 = (long *)std::__cxx11::string::_M_append
                             ((char *)&local_90,(ulong)(what_arg->_M_dataplus)._M_p);
  plVar8 = plVar4 + 2;
  if ((long *)*plVar4 == plVar8) {
    local_a0 = *plVar8;
    lStack_98 = plVar4[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar8;
    local_b0 = (long *)*plVar4;
  }
  local_a8 = plVar4[1];
  *plVar4 = (long)plVar8;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_90 != &local_80) {
    operator_delete(local_90);
  }
  if (local_110 != &local_100) {
    operator_delete(local_110);
  }
  if (local_130 != &local_120) {
    operator_delete(local_130);
  }
  if ((byte_ != 0) && (local_70 != local_60)) {
    operator_delete(local_70);
  }
  if (local_f0 != &local_e0) {
    operator_delete(local_f0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p);
  }
  exception::exception(&__return_storage_ptr__->super_exception,id_,(char *)local_b0);
  *(undefined ***)&__return_storage_ptr__->super_exception = &PTR__exception_0051f4b0;
  __return_storage_ptr__->byte = byte_;
  if (local_b0 != &local_a0) {
    operator_delete(local_b0);
  }
  return __return_storage_ptr__;
}

Assistant:

static parse_error create(int id_, std::size_t byte_, const std::string& what_arg) {
		std::string w = exception::name("parse_error", id_) + "parse error" +
						(byte_ != 0 ? (" at byte " + std::to_string(byte_)) : "") + ": " + what_arg;
		return parse_error(id_, byte_, w.c_str());
	}